

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

ON_ClippingPlaneData * GetClippingPlaneData(uint sn)

{
  bool bVar1;
  ON_ClippingPlaneData *rc;
  bool bReturnLock;
  ON_ClippingPlaneData *pOStack_10;
  uint sn_local;
  
  if (sn == 0) {
    pOStack_10 = (ON_ClippingPlaneData *)0x0;
  }
  else {
    bVar1 = ON_SleepLock::GetLock(&g_data_list_lock);
    pOStack_10 = ON_ClippingPlaneDataList::FromSerialNumber(&g_data_list,sn);
    if (bVar1) {
      ON_SleepLock::ReturnLock(&g_data_list_lock);
    }
  }
  return pOStack_10;
}

Assistant:

static ON_ClippingPlaneData* GetClippingPlaneData(unsigned int sn)
{
  if (0==sn)
    return nullptr;
  
  bool bReturnLock = g_data_list_lock.GetLock();
  ON_ClippingPlaneData* rc = g_data_list.FromSerialNumber(sn);
  if(bReturnLock)
    g_data_list_lock.ReturnLock();
  return rc;
}